

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

void __thiscall QSidebar::selectUrl(QSidebar *this,QUrl *url)

{
  char cVar1;
  int iVar2;
  QItemSelectionModel *pQVar3;
  QAbstractItemModel *pQVar4;
  int i;
  int iVar5;
  long in_FS_OFFSET;
  Object local_98 [8];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QModelIndex local_78;
  QUrl local_60;
  code *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  iVar5 = 0;
  QObject::
  disconnect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QSidebar::*)(QModelIndex_const&)>
            (pQVar3,(offset_in_QItemSelectionModel_to_subr)QItemSelectionModel::currentChanged,
             (Object *)0x0,(offset_in_QSidebar_to_subr)this);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3);
  do {
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
    local_58[0] = (code *)0xffffffffffffffff;
    local_58[1] = (code *)0x0;
    local_58[2] = (code *)0x0;
    iVar2 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,(QVariant *)local_58);
    if (iVar2 <= iVar5) {
LAB_004ae72c:
      pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
      local_58[0] = clicked;
      local_58[1] = (code *)0x0;
      QObject::
      connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QSidebar::*)(QModelIndex_const&)>
                (local_98,(offset_in_QItemSelectionModel_to_subr)pQVar3,
                 (ContextType *)QItemSelectionModel::currentChanged,
                 (offset_in_QSidebar_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
    local_90 = 0xffffffffffffffff;
    local_88 = 0;
    uStack_80 = 0;
    (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar5,0,&local_90);
    QModelIndex::data((QVariant *)local_58,&local_78,0x101);
    ::QVariant::toUrl();
    cVar1 = ::comparesEqual(&local_60,url);
    QUrl::~QUrl(&local_60);
    ::QVariant::~QVariant((QVariant *)local_58);
    if (cVar1 != '\0') {
      pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      local_78.r = -1;
      local_78.c = -1;
      local_78.i = 0;
      local_78.m.ptr = (QAbstractItemModel *)0x0;
      (**(code **)(*(long *)pQVar4 + 0x60))(local_58,pQVar4,iVar5,0);
      (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,local_58,2);
      goto LAB_004ae72c;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void QSidebar::selectUrl(const QUrl &url)
{
    disconnect(selectionModel(), &QItemSelectionModel::currentChanged,
               this, &QSidebar::clicked);

    selectionModel()->clear();
    for (int i = 0; i < model()->rowCount(); ++i) {
        if (model()->index(i, 0).data(QUrlModel::UrlRole).toUrl() == url) {
            selectionModel()->select(model()->index(i, 0), QItemSelectionModel::Select);
            break;
        }
    }

    connect(selectionModel(), &QItemSelectionModel::currentChanged,
            this, &QSidebar::clicked);
}